

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::operator-(impl *this,ExprPtr *lhs,ExprPtr *rhs)

{
  Expr *value;
  Expr *value_00;
  _Variadic_union<std::monostate,_const_int_*,_bool> _Var1;
  ExprPtr *rhs_00;
  bool bVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Variadic_union<std::monostate,_const_int_*,_bool> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Variadic_union<std::monostate,_const_int_*,_bool> this_00;
  Nullary<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:110:28)>
  f;
  anon_class_8_1_ba1d745d f_1;
  ExprPtr EVar6;
  ContextT context;
  _Variadic_union<std::monostate,_const_int_*,_bool> local_118;
  _Variadic_union<std::monostate,_const_int_*,_bool> _Stack_110;
  ExprPtr local_108;
  ExprPtr local_f8;
  _Variadic_union<std::monostate,_const_int_*,_bool> local_e8;
  _Variadic_union<std::monostate,_const_int_*,_bool> _Stack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  _Variadic_union<std::monostate,_const_int_*,_bool> *local_98;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_90;
  ExprPtr *local_68;
  App<const_matchit::impl::AsPointer<int>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>_>
  local_60;
  _Variadic_union<std::monostate,_const_int_*,_bool> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  value = (lhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  value_00 = (rhs->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_60.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_60.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_90.mUnary = (AsPointer<int> *)&matchit::impl::asPointer<int>;
  local_90.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::deref;
  local_90.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Tuple_impl<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<1UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>,_false>
  ._M_head_impl.mPattern = 0;
  local_90.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_90.mPattern.mPatterns.
  super__Tuple_impl<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_int>_>
  .
  super__Head_base<0UL,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_false>
  ._M_head_impl.mPattern = true;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  _Stack_e0 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  lVar3 = 8;
  do {
    *(undefined1 *)((long)&local_e8 + lVar3) = 0;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x48);
  local_a8 = 0;
  local_98 = (_Variadic_union<std::monostate,_const_int_*,_bool> *)this;
  local_68 = rhs;
  local_38 = (_Variadic_union<std::monostate,_const_int_*,_bool> *)lhs;
  bVar2 = matchit::impl::
          matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool>>
                    (value_00,&local_60,1,(Context<const_int_*,_bool,_const_int_*,_bool> *)&local_e8
                    );
  if (bVar2) {
    _Var5 = *local_38;
    this_00 = local_38[1];
    if (this_00 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)((long)this_00 + 8) = *(_Atomic_word *)((long)this_00 + 8) + 1;
      }
    }
  }
  else {
    _Var5 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    this_00 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
  }
  _Var4._M_pi = extraout_RDX;
  if (!bVar2) {
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    _Stack_e0 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
    lVar3 = 8;
    do {
      *(undefined1 *)((long)&local_e8 + lVar3) = 0;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x48);
    local_a8 = 0;
    bVar2 = matchit::impl::
            matchPattern<mathiu::impl::Expr_const&,matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,int>>>,matchit::impl::Context<int_const*,bool,int_const*,bool>>
                      (value,&local_90,1,(Context<const_int_*,_bool,_const_int_*,_bool> *)&local_e8)
    ;
    rhs_00 = local_68;
    _Var4._M_pi = extraout_RDX_00;
    if (bVar2) {
      local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      (local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
      local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      *(undefined4 *)
       &local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[1]._vptr__Sp_counted_base = 0xffffffff;
      *(undefined1 *)
       &local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[4]._M_use_count = 0;
      EVar6 = operator*((impl *)&local_118,&local_108,rhs_00);
      _Var4 = EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.
                   super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = extraout_RDX_01;
      }
      _Var1 = _Stack_110;
      _Var5 = local_118;
      local_118 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      _Stack_110 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      if (this_00 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        _Var4._M_pi = extraout_RDX_02;
      }
      this_00 = _Var1;
      if (_Stack_110 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_110);
        _Var4._M_pi = extraout_RDX_03;
      }
    }
    if (!bVar2) {
      local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_use_count = 1;
      (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_M_weak_count = 1;
      (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
      local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi + 1);
      *(undefined4 *)
       &local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[1]._vptr__Sp_counted_base = 1;
      *(undefined1 *)
       &local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[4]._M_use_count = 0;
      local_e8 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      _Stack_e0 = (_Variadic_union<std::monostate,_const_int_*,_bool>)operator_new(0x50);
      *(undefined8 *)((long)_Stack_e0 + 8) = 0x100000001;
      *(undefined ***)_Stack_e0 = &PTR___Sp_counted_ptr_inplace_00253718;
      local_e8 = (_Variadic_union<std::monostate,_const_int_*,_bool>)((long)_Stack_e0 + 0x10);
      *(undefined4 *)
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Stack_e0 + 0x10))->
        _vptr__Sp_counted_base = 0xffffffff;
      *(undefined1 *)((long)_Stack_e0 + 0x48) = 0;
      operator*((impl *)&local_118,(ExprPtr *)&local_e8,&local_f8);
      if (_Stack_e0 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e0);
      }
      operator*((impl *)&local_108,(ExprPtr *)&local_118,rhs);
      EVar6 = operator+((impl *)&local_e8,lhs,&local_108);
      _Var4 = EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_108.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.
                   super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = extraout_RDX_04;
      }
      if (_Stack_110 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_110);
        _Var4._M_pi = extraout_RDX_05;
      }
      if (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var4._M_pi = extraout_RDX_06;
      }
      _Var1 = _Stack_e0;
      _Var5 = local_e8;
      local_e8 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      _Stack_e0 = (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0;
      if (this_00 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        _Var4._M_pi = extraout_RDX_07;
      }
      this_00 = _Var1;
      if (_Stack_e0 != (_Variadic_union<std::monostate,_const_int_*,_bool>)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_e0);
        _Var4._M_pi = extraout_RDX_08;
      }
    }
  }
  *local_98 = _Var5;
  local_98[1] = this_00;
  EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_98;
  return (ExprPtr)EVar6.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator-(ExprPtr const &lhs, ExprPtr const &rhs)
        {
            return match(*lhs, *rhs)
            (
                // basic identity transformation
                pattern | ds(_, as<Integer>(0)) = expr(lhs),
                pattern | ds(as<Integer>(0), _) = [&] { return -rhs; },
                pattern | _ = [&] { return lhs + -1_i * rhs; }
            );
        }